

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O1

void __thiscall
LASwriteItemCompressed_POINT14_v3::~LASwriteItemCompressed_POINT14_v3
          (LASwriteItemCompressed_POINT14_v3 *this)

{
  ArithmeticModel *m;
  IntegerCompressor *pIVar1;
  ArithmeticEncoder *pAVar2;
  long lVar3;
  ArithmeticModel **ppAVar4;
  ArithmeticModel **ppAVar5;
  long lVar6;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_0015f1a0;
  ppAVar4 = this->contexts[0].m_return_number;
  ppAVar5 = this->contexts[0].m_user_data;
  lVar3 = 0;
  do {
    m = this->contexts[lVar3].m_changed_values[0];
    if (m != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc_channel_returns_XY,m);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_changed_values[1]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_changed_values[2]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_changed_values[3]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_changed_values[4]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_changed_values[5]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_changed_values[6]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_changed_values[7]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_scanner_channel);
      lVar6 = -0x10;
      do {
        if (ppAVar4[lVar6 + -1] != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_channel_returns_XY,ppAVar4[lVar6 + -1]);
        }
        if (ppAVar4[lVar6 + 0x10] != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_channel_returns_XY,ppAVar4[lVar6 + 0x10]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_channel_returns_XY,this->contexts[lVar3].m_return_number_gps_same);
      pIVar1 = this->contexts[lVar3].ic_dX;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[lVar3].ic_dY;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[lVar3].ic_Z;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      lVar6 = -0x40;
      do {
        if (ppAVar5[lVar6 + -0x40] != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_classification,ppAVar5[lVar6 + -0x40]);
        }
        if (ppAVar5[lVar6] != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_flags,ppAVar5[lVar6]);
        }
        if (ppAVar5[lVar6 + 0x40] != (ArithmeticModel *)0x0) {
          ArithmeticEncoder::destroySymbolModel(this->enc_user_data,ppAVar5[lVar6 + 0x40]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
      pIVar1 = this->contexts[lVar3].ic_intensity;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[lVar3].ic_scan_angle;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[lVar3].ic_point_source_ID;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      ArithmeticEncoder::destroySymbolModel
                (this->enc_gps_time,this->contexts[lVar3].m_gpstime_multi);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_gps_time,this->contexts[lVar3].m_gpstime_0diff);
      pIVar1 = this->contexts[lVar3].ic_gpstime;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
    }
    lVar3 = lVar3 + 1;
    ppAVar4 = ppAVar4 + 0x15b;
    ppAVar5 = ppAVar5 + 0x15b;
  } while (lVar3 != 4);
  if (this->outstream_channel_returns_XY != (ByteStreamOutArray *)0x0) {
    pAVar2 = this->enc_channel_returns_XY;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    pAVar2 = this->enc_Z;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    pAVar2 = this->enc_classification;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    pAVar2 = this->enc_flags;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    pAVar2 = this->enc_intensity;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    pAVar2 = this->enc_scan_angle;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    pAVar2 = this->enc_user_data;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    pAVar2 = this->enc_point_source;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    pAVar2 = this->enc_gps_time;
    if (pAVar2 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(pAVar2);
      operator_delete(pAVar2);
    }
    if (this->outstream_channel_returns_XY != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_channel_returns_XY->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_Z != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_Z->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_classification != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_classification->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_flags != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_flags->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_intensity != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_intensity->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_scan_angle != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_scan_angle->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_user_data != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_user_data->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_point_source != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_point_source->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    if (this->outstream_gps_time != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_gps_time->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
      return;
    }
  }
  return;
}

Assistant:

LASwriteItemCompressed_POINT14_v3::~LASwriteItemCompressed_POINT14_v3()
{
  U32 c, i;

  /* destroy all initialized scanner channel contexts */

  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_changed_values[0])
    {
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[0]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[1]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[2]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[3]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[4]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[5]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[6]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_changed_values[7]);
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_scanner_channel);
      for (i = 0; i < 16; i++)
      {
        if (contexts[c].m_number_of_returns[i]) enc_channel_returns_XY->destroySymbolModel(contexts[c].m_number_of_returns[i]);
        if (contexts[c].m_return_number[i]) enc_channel_returns_XY->destroySymbolModel(contexts[c].m_return_number[i]);
      }
      enc_channel_returns_XY->destroySymbolModel(contexts[c].m_return_number_gps_same);
      delete contexts[c].ic_dX;
      delete contexts[c].ic_dY;
      delete contexts[c].ic_Z;
      for (i = 0; i < 64; i++)
      {
        if (contexts[c].m_classification[i]) enc_classification->destroySymbolModel(contexts[c].m_classification[i]);
        if (contexts[c].m_flags[i]) enc_flags->destroySymbolModel(contexts[c].m_flags[i]);
        if (contexts[c].m_user_data[i]) enc_user_data->destroySymbolModel(contexts[c].m_user_data[i]);
      }
      delete contexts[c].ic_intensity;
      delete contexts[c].ic_scan_angle;
      delete contexts[c].ic_point_source_ID;
      enc_gps_time->destroySymbolModel(contexts[c].m_gpstime_multi);
      enc_gps_time->destroySymbolModel(contexts[c].m_gpstime_0diff);
      delete contexts[c].ic_gpstime;
    }
  }

  /* destroy all encoders and outstreams  */

  if (outstream_channel_returns_XY)
  {
    delete enc_channel_returns_XY;
    delete enc_Z;
    delete enc_classification;
    delete enc_flags;
    delete enc_intensity;
    delete enc_scan_angle;
    delete enc_user_data;
    delete enc_point_source;
    delete enc_gps_time;

    delete outstream_channel_returns_XY;
    delete outstream_Z;
    delete outstream_classification;
    delete outstream_flags;
    delete outstream_intensity;
    delete outstream_scan_angle;
    delete outstream_user_data;
    delete outstream_point_source;
    delete outstream_gps_time;
  }

//  LASMessage(LAS_VERBOSE, "%u %u %u %u %u %u %u %u %u", num_bytes_channel_returns_XY, num_bytes_Z, num_bytes_classification, num_bytes_flags, num_bytes_intensity, num_bytes_scan_angle, num_bytes_user_data, num_bytes_point_source, num_bytes_gps_time);
}